

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

void __thiscall
tinyusdz::TypedTimeSamples<std::array<float,_3UL>_>::add_sample
          (TypedTimeSamples<std::array<float,_3UL>_> *this,double t,array<float,_3UL> *v)

{
  Sample s;
  Sample local_20;
  
  local_20.blocked = false;
  local_20.value._M_elems._0_8_ = *(undefined8 *)v->_M_elems;
  local_20.value._M_elems[2] = v->_M_elems[2];
  local_20.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::array<float,3ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,3ul>>::Sample>>
  ::emplace_back<tinyusdz::TypedTimeSamples<std::array<float,3ul>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::array<float,3ul>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::array<float,3ul>>::Sample>>
              *)this,&local_20);
  this->_dirty = true;
  return;
}

Assistant:

void add_sample(const double t, const T &v) {
    Sample s;
    s.t = t;
    s.value = v;
    _samples.emplace_back(s);
    _dirty = true;
  }